

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# preprocessor.cpp
# Opt level: O3

tuple<int,_bool> __thiscall
anon_unknown.dwarf_14a0b5::preprocessor<baryonyx::raw_problem>::reduce_greater_constraint
          (preprocessor<baryonyx::raw_problem> *this,constraint *constraint)

{
  uint uVar1;
  _Tuple_impl<0UL,_int,_bool> _Var2;
  bool bVar3;
  int local_1c;
  uint local_18;
  int local_14;
  
  reduce((preprocessor<baryonyx::raw_problem> *)&stack0xffffffffffffffe4,constraint);
  if ((int)local_18 < 0) {
    _Var2.super__Tuple_impl<1UL,_bool>.super__Head_base<1UL,_bool,_false>._M_head_impl =
         (_Head_base<1UL,_bool,_false>)0xff;
    _Var2._1_3_ = 0xffffff;
    _Var2.super__Head_base<0UL,_int,_false>._M_head_impl = 0;
    bVar3 = false;
  }
  else {
    uVar1 = 0xffffffff;
    if (local_14 < local_1c) {
      uVar1 = local_18;
    }
    bVar3 = 0 < local_1c;
    if (0 < local_1c) {
      uVar1 = local_18;
    }
    _Var2.super__Head_base<0UL,_int,_false>._M_head_impl = 0;
    _Var2._0_4_ = uVar1;
    if (0 < local_1c && local_14 < local_1c) {
      baryonyx::details::fail_fast
                ("Reached","cond",
                 "/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/lib/src/preprocessor.cpp"
                 ,"237");
    }
  }
  *(bool *)&this->ctx = bVar3;
  *(int *)((long)&this->ctx + 4) = _Var2._0_4_;
  return (tuple<int,_bool>)_Var2;
}

Assistant:

auto reduce_greater_constraint(const bx::constraint& constraint)
      -> std::tuple<int, bool>
    {
        int factor, variable, result;

        std::tie(factor, variable, result) = reduce(constraint);

        if (variable < 0)
            return std::make_tuple(-1, false);

        bool affect_0 = (factor * 0 >= result);
        bool affect_1 = (factor * 1 >= result);

        if (affect_0 && affect_1)
            return std::make_tuple(-1, false);

        if (affect_0)
            return std::make_tuple(variable, false);

        if (affect_1)
            return std::make_tuple(variable, true);

        bx_reach();
    }